

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

double despot::erf(double param_1)

{
  double dVar1;
  double dVar2;
  
  dVar2 = 1.0 / (ABS(param_1) * 0.3275911 + 1.0);
  dVar1 = exp((double)((ulong)param_1 | (ulong)DAT_0017ff40) * ABS(param_1));
  dVar1 = 1.0 - ((((dVar2 * 1.061405429 + -1.453152027) * dVar2 + 1.421413741) * dVar2 +
                 -0.284496736) * dVar2 + 0.254829592) * dVar2 * dVar1;
  return (double)(-(ulong)(param_1 < 0.0) & (ulong)-dVar1 | ~-(ulong)(param_1 < 0.0) & (ulong)dVar1)
  ;
}

Assistant:

double erf(double x) {
	// constants
	double a1 = 0.254829592;
	double a2 = -0.284496736;
	double a3 = 1.421413741;
	double a4 = -1.453152027;
	double a5 = 1.061405429;
	double p = 0.3275911;
	// Save the sign of x
	int sign = 1;
	if (x < 0)
		sign = -1;
	x = fabs(x);
	// A&S formula 7.1.26
	double t = 1.0 / (1.0 + p * x);
	double y = 1.0
		- (((((a5 * t + a4) * t) + a3) * t + a2) * t + a1) * t * exp(-x * x);

	return sign * y;
}